

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

string * create_sampler_address_abi_cxx11_
                   (string *__return_storage_ptr__,char *prefix,MSLSamplerAddress addr)

{
  string *psVar1;
  runtime_error *this;
  char *pcVar2;
  char *local_48;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  local_48 = prefix;
  switch(addr) {
  case MSL_SAMPLER_ADDRESS_CLAMP_TO_ZERO:
    pcVar2 = "address::clamp_to_zero";
    break;
  case MSL_SAMPLER_ADDRESS_CLAMP_TO_EDGE:
    pcVar2 = "address::clamp_to_edge";
    break;
  case MSL_SAMPLER_ADDRESS_CLAMP_TO_BORDER:
    pcVar2 = "address::clamp_to_border";
    goto LAB_0024b449;
  case MSL_SAMPLER_ADDRESS_REPEAT:
    psVar1 = spirv_cross::join<char_const*&,char_const(&)[16]>
                       (__return_storage_ptr__,(spirv_cross *)&local_48,(char **)"address::repeat",
                        (char (*) [16])&switchD_0024b42e::switchdataD_002e64d0);
    return psVar1;
  case MSL_SAMPLER_ADDRESS_MIRRORED_REPEAT:
    pcVar2 = "address::mirrored_repeat";
LAB_0024b449:
    psVar1 = spirv_cross::join<char_const*&,char_const(&)[25]>
                       (__return_storage_ptr__,(spirv_cross *)&local_48,(char **)pcVar2,
                        (char (*) [25])&switchD_0024b42e::switchdataD_002e64d0);
    return psVar1;
  default:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,"Invalid sampler addressing mode.","");
    std::runtime_error::runtime_error(this,(string *)local_40);
    *(undefined ***)this = &PTR__runtime_error_00357118;
    __cxa_throw(this,&spirv_cross::CompilerError::typeinfo,std::runtime_error::~runtime_error);
  }
  psVar1 = spirv_cross::join<char_const*&,char_const(&)[23]>
                     (__return_storage_ptr__,(spirv_cross *)&local_48,(char **)pcVar2,
                      (char (*) [23])&switchD_0024b42e::switchdataD_002e64d0);
  return psVar1;
}

Assistant:

static string create_sampler_address(const char *prefix, MSLSamplerAddress addr)
{
	switch (addr)
	{
	case MSL_SAMPLER_ADDRESS_CLAMP_TO_EDGE:
		return join(prefix, "address::clamp_to_edge");
	case MSL_SAMPLER_ADDRESS_CLAMP_TO_ZERO:
		return join(prefix, "address::clamp_to_zero");
	case MSL_SAMPLER_ADDRESS_CLAMP_TO_BORDER:
		return join(prefix, "address::clamp_to_border");
	case MSL_SAMPLER_ADDRESS_REPEAT:
		return join(prefix, "address::repeat");
	case MSL_SAMPLER_ADDRESS_MIRRORED_REPEAT:
		return join(prefix, "address::mirrored_repeat");
	default:
		SPIRV_CROSS_THROW("Invalid sampler addressing mode.");
	}
}